

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O2

void __thiscall RandomizerWorld::load_regions(RandomizerWorld *this)

{
  bool bVar1;
  reference json;
  _Base_ptr p_Var2;
  LandstalkerException *this_00;
  WorldRegion *local_b0;
  Json regions_json;
  iterator __end1;
  iterator __begin1;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  uStack_40 = 0;
  nlohmann::
  basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<unsigned_char_const(&)[8279]>
            ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&regions_json,
             (uchar (*) [8279])
             "[\n    {\n        \"name\": \"Massan\",\n        \"hintName\": \"in the village of Massan\",\n        \"nodeIds\": [\n            \"massan\",\n            \"massan_after_swamp_shrine\"\n        ]\n    },\n    {\n        \"name\": \"Massan Cave\",\n        \"hintName\": \"in the cave near Massan\",\n        \"nodeIds\": [\n            \"massan_cave\"\n        ],\n        \"darkMapIds\": [\n            803, 804, 805, 806, 807\n        ]\n    },\n    {\n        \"name\": \"Route between Massan and Gumi\",\n        \"canBeHintedAsRequired\": false,\n        \"nodeIds\": [\n            \"route_massan_gumi\"\n        ]\n    },\n    {\n        \"name\": \"Waterfall Shrine\",\n        \"hintName\": \"in the waterfall shrine\",\n        \"nodeIds\": [\n            \"waterfall_shrine\"\n        ],\n        \"darkMapIds\": [\n            174, 175, 176, 177, 178, 179, 180, 181, 182\n        ]\n    },\n    {\n        \"name\": \"Swamp Shrine\",\n        \"hintName\": \"in the swamp shrine\",\n        \"canBeHintedAsRequired\": false,\n        \"nodeIds\": [\n            \"swamp_shrine\"\n        ],\n        \"darkMapIds\": [\n            0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 12, 13, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 27, 30\n        ]\n    },\n    {\n        \"name\": \"Gumi\",\n        \"hintName\": \"in the village of Gumi\",\n        \"nodeIds\": [\n            \"gumi\",\n            \"gumi_after_swamp_shrine\"\n        ]\n    },\n    {\n        \"name\": \"Route between Gumi and Ryuma\",\n        \"canBeHintedAsRequired\": false,\n        \"nodeIds\": [\n            \"route_gumi_ryuma\"\n        ]\n    },\n    {\n        \"name\": \"Tibor\",\n        \"hintName\": \"inside Tibor\",\n        \"nodeIds\": [\n            \"tibor\"\n        ],\n        \"darkMapIds\": [\n            808, 809, 810, 811, 812, 813, 814, 815\n        ]\n    },\n    {\n        \"name\": \"Ryuma\",\n        \"hintName\": \"in the town of Ryuma\",\n        \"nodeIds\": [\n            \"ryuma\",\n            \"ryuma_after_thieves_hideout\",\n            \"ryuma_lighthouse_repaired\"\n        ]\n    },\n    {\n        \"name\": \"Thieves Hideout\",\n        \"hintName\": \"in the thieves\' hideout\",\n        \"nodeIds\": [\n            \"thieves_hideout_pre_key\",\n..." /* TRUNCATED STRING LITERAL */
             ,(parser_callback_t *)&local_58,true,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin(&__begin1,&regions_json);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::end(&__end1,&regions_json);
  while( true ) {
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator!=<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&__begin1,&__end1);
    if (!bVar1) break;
    json = nlohmann::detail::
           iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator*(&__begin1);
    local_b0 = WorldRegion::from_json(json,&this->_nodes);
    std::vector<WorldRegion*,std::allocator<WorldRegion*>>::emplace_back<WorldRegion*>
              ((vector<WorldRegion*,std::allocator<WorldRegion*>> *)&this->_regions,&local_b0);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(&__begin1);
  }
  p_Var2 = (this->_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(this->_nodes)._M_t._M_impl.super__Rb_tree_header) {
      nlohmann::
      basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&regions_json);
      return;
    }
    if (*(long *)(*(long *)(p_Var2 + 2) + 0xa0) == 0) break;
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end1,
                 "Node \'",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(p_Var2 + 2)
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end1,
                 "\' doesn\'t belong to any region");
  LandstalkerException::LandstalkerException(this_00,(string *)&__begin1);
  __cxa_throw(this_00,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException);
}

Assistant:

void RandomizerWorld::load_regions()
{
    Json regions_json = Json::parse(WORLD_REGIONS_JSON);
    for(const Json& region_json : regions_json)
        _regions.emplace_back(WorldRegion::from_json(region_json, _nodes));

    for(auto& [id, node] : _nodes)
        if(node->region() == nullptr)
            throw LandstalkerException("Node '" + node->id() + "' doesn't belong to any region");
}